

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void beta_values(int *n_data,double *x,double *y,double *fxy)

{
  int iVar1;
  long lVar2;
  
  if (*n_data < 0) {
    *n_data = 0;
  }
  iVar1 = *n_data;
  lVar2 = (long)iVar1;
  if (lVar2 < 0x11) {
    *x = *(double *)(&DAT_002273e0 + lVar2 * 8);
    *y = *(double *)(&DAT_00227470 + lVar2 * 8);
    *fxy = *(double *)(&DAT_00227350 + lVar2 * 8);
    *n_data = iVar1 + 1;
  }
  else {
    *n_data = 0;
    *x = 0.0;
    *y = 0.0;
    *fxy = 0.0;
  }
  return;
}

Assistant:

void beta_values ( int *n_data, double *x, double *y, double *fxy )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_VALUES returns some values of the Beta function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and
//    N_DATA is set to the index of the test data.  On each subsequent
//    call, N_DATA is incremented and that test data is returned.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, double *X, *Y, the arguments of the function.
//
//    Output, double *FXY, the value of the function.
//
{
# define N_MAX 17

  double b_vec[N_MAX] = {
    5.000000, 2.500000, 1.666667, 1.250000, 
    5.000000, 2.500000, 1.000000, 1.666667E-01, 
    0.333333E-01, 7.142857E-03, 1.587302E-03, 0.238095E-01, 
    5.952381E-03, 1.984127E-03, 7.936508E-04, 3.607504E-04, 
    8.325008E-05 };

  double x_vec[N_MAX] = {
    0.2, 0.4, 0.6, 0.8, 
    1.0, 1.0, 1.0, 2.0, 
    3.0, 4.0, 5.0, 6.0, 
    6.0, 6.0, 6.0, 6.0, 
    7.0 };

  double y_vec[N_MAX] = {
    1.0, 1.0, 1.0, 1.0, 
    0.2, 0.4, 1.0, 2.0, 
    3.0, 4.0, 5.0, 2.0, 
    3.0, 4.0, 5.0, 6.0, 
    7.0 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }
  
  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *x = 0.0;
    *y = 0.0;
    *fxy = 0.0;
  }
  else
  {
    *x = x_vec[*n_data];
    *y = y_vec[*n_data];
    *fxy = b_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}